

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O1

void * __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC>::setUnion
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC> *this,void *A,void *B)

{
  void *__s;
  size_t __i;
  long lVar1;
  bitset<16000UL> __result;
  ulong local_7f0 [250];
  
  __s = operator_new(2000);
  lVar1 = 0;
  memset(__s,0,2000);
  memcpy(local_7f0,A,2000);
  do {
    local_7f0[lVar1] = local_7f0[lVar1] | *(ulong *)((long)B + lVar1 * 8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xfa);
  memcpy(__s,local_7f0,2000);
  return __s;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setUnion(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) | (*__B__);
	return __C__;
}